

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall Client::Start(Client *this)

{
  int32_t interval;
  CppNet *this_00;
  int iVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = this->_net;
  interval = this->_timeout;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(code **)local_48._M_unused._0_8_ = HandleTimeout;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(Client **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  local_30 = std::
             _Function_handler<void_(void_*),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>))(void_*)>_>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(void_*),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>))(void_*)>_>
             ::_M_manager;
  cppnet::CppNet::AddTimer(this_00,interval,(user_timer_call_back *)&local_48,(void *)0x0,false);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (0 < this->_session_count) {
    iVar1 = 0;
    do {
      cppnet::CppNet::Connection(this->_net,&this->_ip,(uint16_t)this->_port);
      iVar1 = iVar1 + 1;
    } while (iVar1 < this->_session_count);
  }
  return;
}

Assistant:

void Start() {
        _net->AddTimer(_timeout, std::bind(&Client::HandleTimeout, this, std::placeholders::_1), nullptr);

        for (int i = 0; i < _session_count; ++i) {
            _net->Connection(_ip, _port);
        }
    }